

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O3

_Bool gravity_hash_insert(gravity_hash_t *hashtable,gravity_value_t key,gravity_value_t value)

{
  hash_node_s *phVar1;
  gravity_hash_iterate_fn p_Var2;
  hash_node_t **pphVar3;
  _Bool _Var4;
  uint32_t uVar5;
  hash_node_t *phVar6;
  uint uVar7;
  ulong uVar8;
  gravity_hash_t local_68;
  
  if (hashtable->count < 0x40000000) {
    uVar5 = (*hashtable->compute_fn)(key);
    uVar7 = hashtable->size;
    uVar8 = (ulong)uVar5 % (ulong)uVar7;
    phVar6 = hashtable->nodes[uVar8];
    if (phVar6 != (hash_node_t *)0x0) {
      hashtable->ncollision = hashtable->ncollision + 1;
      do {
        if (phVar6->hash == uVar5) {
          _Var4 = (*hashtable->isequal_fn)(key,phVar6->key);
          if (_Var4) {
            (phVar6->value).isa = value.isa;
            (phVar6->value).field_1.n = (gravity_int_t)value.field_1;
            goto LAB_00129814;
          }
        }
        phVar6 = phVar6->next;
      } while (phVar6 != (hash_node_s *)0x0);
      uVar7 = hashtable->size;
    }
    if ((double)uVar7 * 0.75 <= (double)hashtable->count) {
      local_68.size = uVar7 * 2;
      local_68.count = 0;
      local_68.compute_fn = hashtable->compute_fn;
      local_68.isequal_fn = hashtable->isequal_fn;
      local_68.free_fn = (gravity_hash_iterate_fn)0x0;
      local_68.data = (void *)0x0;
      local_68.ncollision = 0;
      local_68.nresize = 0;
      local_68.nodes = (hash_node_t **)gravity_calloc((gravity_vm *)0x0,(ulong)local_68.size,8);
      if (local_68.nodes == (hash_node_t **)0x0) goto LAB_00129814;
      uVar7 = hashtable->size;
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          phVar6 = hashtable->nodes[uVar8];
          if (hashtable->nodes[uVar8] != (hash_node_t *)0x0) {
            do {
              phVar1 = phVar6->next;
              gravity_hash_insert(&local_68,phVar6->key,phVar6->value);
              p_Var2 = hashtable->free_fn;
              hashtable->free_fn = (gravity_hash_iterate_fn)0x0;
              gravity_hash_remove(hashtable,phVar6->key);
              hashtable->free_fn = p_Var2;
              phVar6 = phVar1;
            } while (phVar1 != (hash_node_s *)0x0);
            uVar7 = hashtable->size;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar7);
      }
      free(hashtable->nodes);
      hashtable->size = local_68.size;
      hashtable->count = local_68.count;
      hashtable->nodes = local_68.nodes;
      hashtable->nresize = hashtable->nresize + 1;
      uVar8 = (ulong)uVar5 % (ulong)local_68.size;
    }
    _Var4 = false;
    phVar6 = (hash_node_t *)gravity_calloc((gravity_vm *)0x0,1,0x30);
    if (phVar6 != (hash_node_t *)0x0) {
      (phVar6->key).isa = key.isa;
      (phVar6->key).field_1.n = (gravity_int_t)key.field_1;
      phVar6->hash = uVar5;
      (phVar6->value).isa = value.isa;
      (phVar6->value).field_1.n = (gravity_int_t)value.field_1;
      pphVar3 = hashtable->nodes;
      phVar6->next = pphVar3[uVar8];
      pphVar3[uVar8] = phVar6;
      hashtable->count = hashtable->count + 1;
      _Var4 = true;
    }
  }
  else {
LAB_00129814:
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool gravity_hash_insert (gravity_hash_t *hashtable, gravity_value_t key, gravity_value_t value) {
    if (hashtable->count >= GRAVITYHASH_MAXENTRIES) return false;
    
    register uint32_t hash = hashtable->compute_fn(key);
    register uint32_t position = hash % hashtable->size;

    hash_node_t *node = hashtable->nodes[position];
    if (node) INC_COLLISION(hashtable);

    // check if the key is already in the table
    while (node) {
        if ((node->hash == hash) && (hashtable->isequal_fn(key, node->key))) {
            node->value = value;
            return false;
        }
        node = node->next;
    }

    // resize table if the threshold is exceeded
    // default threshold is: <table size> * <load factor GRAVITYHASH_THRESHOLD>
    if (hashtable->count >= hashtable->size * GRAVITYHASH_THRESHOLD) {
        if (gravity_hash_resize(hashtable) == -1) return false;
        // recompute position here because hashtable->size has changed!
        position = hash % hashtable->size;
    }

    // allocate new entry and set new data
    if (!(node = mem_alloc(NULL, sizeof(hash_node_t)))) return false;
    node->key = key;
    node->hash = hash;
    node->value = value;
    node->next = hashtable->nodes[position];
    hashtable->nodes[position] = node;
    ++hashtable->count;

    return true;
}